

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampParameterTextureBorderColor.cpp
# Opt level: O2

void __thiscall
glcts::TextureBorderClampParameterTextureBorderColor::initTest
          (TextureBorderClampParameterTextureBorderColor *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  NotSupportedError *this_01;
  uint local_1c;
  
  if ((this->super_TextureBorderClampBase).super_TestCaseBase.m_is_texture_border_clamp_supported !=
      false) {
    this_00 = &this->m_texture_targets;
    local_1c = 0xde1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,&local_1c);
    local_1c = 0x8c1a;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,&local_1c);
    local_1c = 0x806f;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,&local_1c);
    local_1c = 0x8513;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_00,&local_1c);
    if ((this->super_TextureBorderClampBase).super_TestCaseBase.
        m_is_texture_cube_map_array_supported == true) {
      local_1c = 0x9009;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (this_00,&local_1c);
    }
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Texture border clamp functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampParameterTextureBorderColor.cpp"
             ,99);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBorderClampParameterTextureBorderColor::initTest(void)
{
	/* Check whether GL_EXT_texture_border_clamp is supported */
	if (!m_is_texture_border_clamp_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BORDER_CLAMP_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Fill array with texture targets used in the test */
	m_texture_targets.push_back(GL_TEXTURE_2D);
	m_texture_targets.push_back(GL_TEXTURE_2D_ARRAY);
	m_texture_targets.push_back(GL_TEXTURE_3D);
	m_texture_targets.push_back(GL_TEXTURE_CUBE_MAP);

	/* Also consider GL_TEXTURE_CUBE_MAP_ARRAY_EXT, but only if
	 * GL_EXT_texture_cube_map_array is supported
	 */
	if (m_is_texture_cube_map_array_supported)
	{
		m_texture_targets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	}
}